

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O1

void interpolative_internal::encode_interpolative
               (bit_stream *os,uint32_t *in_buf,size_t n,size_t low,size_t high)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t bits;
  uint val;
  ulong high_00;
  ulong uVar5;
  ulong uVar6;
  
  while (n != 0) {
    uVar6 = n + 1 >> 1;
    n = n - uVar6;
    high_00 = (ulong)in_buf[uVar6 - 1];
    lVar3 = high - ((uVar6 - 1) + low + n);
    if (lVar3 != 0) {
      uVar2 = lVar3 + 1;
      bits = LZCOUNT(lVar3) ^ 0x3f;
      lVar1 = 2L << (bits & 0x3f);
      uVar5 = high_00 + ((lVar3 + 4) - (((ulong)((lVar3 * 2 + 2) - lVar1) >> 1) + uVar6 + low));
      uVar4 = 0;
      if (uVar2 < uVar5) {
        uVar4 = uVar2;
      }
      uVar5 = uVar5 - uVar4;
      uVar2 = (ulong)(uint)((int)lVar1 - (int)uVar2);
      if (uVar2 < uVar5) {
        uVar5 = (uVar2 - 1) + uVar5;
        bit_stream::put_int(os,(uint32_t)(uVar5 >> 1),bits);
        val = (uint)uVar5 & 1;
        bits = 1;
      }
      else {
        val = (int)uVar5 - 1;
      }
      bit_stream::put_int(os,val,bits);
    }
    encode_interpolative(os,in_buf,uVar6 - 1,low,high_00);
    in_buf = in_buf + uVar6;
    low = high_00 + 2;
  }
  return;
}

Assistant:

static inline void encode_interpolative(bit_stream& os,
        const uint32_t* in_buf, size_t n, size_t low, size_t high)
    {
        if (n == 0ULL)
            return;
        uint64_t h = (n + 1ULL) >> 1ULL;
        uint64_t n1 = h - 1ULL;
        uint64_t n2 = n - h;
        uint64_t v = in_buf[h - 1ULL] + 1ULL; // we don't encode 0

        write_center_mid(os, v - low - n1 + 1ULL, high - n2 - low - n1 + 1ULL);

        encode_interpolative(os, in_buf, n1, low, v - 1ULL);
        encode_interpolative(os, in_buf + h, n2, v + 1ULL, high);
    }